

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAnalogEvent.cpp
# Opt level: O2

float __thiscall MinVR::VRAnalogEvent::getValue(VRAnalogEvent *this)

{
  VRDataIndex *pVVar1;
  bool bVar2;
  VRAnyCoreType VVar3;
  VRError *this_00;
  float extraout_XMM0_Da;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  float local_120;
  int local_11c;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pVVar1 = this->_index;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"AnalogValue",(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"",(allocator<char> *)&local_f8);
  bVar2 = VRDataIndex::exists(pVVar1,&local_118,&local_98,true);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_118);
  if (bVar2) {
    pVVar1 = this->_index;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"AnalogValue",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"",(allocator<char> *)&local_f8);
    VVar3 = VRDataIndex::getValue(pVVar1,&local_118,&local_b8,true);
    (*(VVar3.datum)->_vptr_VRDatum[8])(VVar3.datum);
    local_120 = extraout_XMM0_Da;
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_118);
    return local_120;
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  std::__cxx11::string::string((string *)&local_f8,(string *)&this->_index->_indexName);
  std::operator+(&local_d8,
                 "VRAnalogEvent::getValue() cannot determine a data field to return for event named "
                 ,&local_f8);
  std::operator+(&local_118,&local_d8,".");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "Analog events should have an entry in their data index called AnalogValue.",&local_121
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/api/impl/VRAnalogEvent.cpp"
             ,&local_122);
  local_11c = 0x28;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"float MinVR::VRAnalogEvent::getValue() const",&local_123);
  VRError::VRError(this_00,&local_118,&local_38,&local_58,&local_11c,&local_78);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

float VRAnalogEvent::getValue() const {
    if (_index.exists("AnalogValue")) {
        return _index.getValue("AnalogValue");
    }
    else {
        VRERROR("VRAnalogEvent::getValue() cannot determine a data field to return for event named " +
                _index.getName() + ".", "Analog events should have an entry in their data index called AnalogValue.");
        return 0.0f;
    }
}